

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateOneElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  xmlNs **ppxVar1;
  xmlElementType xVar2;
  xmlAttributePtr pxVar3;
  _xmlAttr *p_Var4;
  _xmlElementContent *p_Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  xmlElementPtr elem_00;
  xmlNs *pxVar9;
  _xmlNode **pp_Var10;
  xmlChar *pxVar11;
  xmlRegExecCtxtPtr exec;
  _xmlNode *p_Var12;
  size_t sVar13;
  char *pcVar14;
  xmlNode *node;
  xmlParserErrors xVar15;
  byte *pbVar16;
  uint uVar17;
  ulong uVar18;
  xmlRegexpPtr comp;
  int iVar19;
  _xmlAttr **pp_Var20;
  xmlElementContentPtr pxVar21;
  xmlElementContentPtr pxVar22;
  xmlAttributePtr *ppxVar23;
  xmlChar *pxVar24;
  xmlChar *pxVar25;
  int extsubset;
  xmlElementContentPtr local_2758;
  xmlChar *local_2750;
  xmlChar local_2748 [4];
  undefined2 auStack_2744 [2502];
  xmlChar fn [50];
  
  extsubset = 0;
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  if (doc->intSubset == (_xmlDtd *)0x0) {
    if (elem == (xmlNodePtr)0x0) {
      return 0;
    }
    if (doc->extSubset == (_xmlDtd *)0x0) {
      return 0;
    }
  }
  else if (elem == (xmlNodePtr)0x0) {
    return 0;
  }
  iVar19 = 1;
  switch(elem->type) {
  case XML_ELEMENT_NODE:
    elem_00 = xmlValidGetElemDecl(ctxt,doc,elem,&extsubset);
    if (elem_00 == (xmlElementPtr)0x0) {
      return 0;
    }
    iVar19 = 1;
    if (ctxt->vstateNr != 0) goto switchD_0018db6a_caseD_2;
    iVar19 = 1;
    switch(elem_00->etype) {
    case XML_ELEMENT_TYPE_UNDEFINED:
      pxVar25 = elem->name;
      pcVar14 = "No declaration for element %s\n";
      xVar15 = XML_DTD_UNKNOWN_ELEM;
      break;
    case XML_ELEMENT_TYPE_EMPTY:
      iVar19 = 1;
      if (elem->children == (_xmlNode *)0x0) goto switchD_0018db6a_caseD_2;
      pxVar25 = elem->name;
      pcVar14 = "Element %s was declared EMPTY this one has content\n";
      xVar15 = XML_DTD_NOT_EMPTY;
      goto LAB_0018e21a;
    default:
      goto switchD_0018db6a_caseD_2;
    case XML_ELEMENT_TYPE_MIXED:
      if ((elem_00->content == (xmlElementContentPtr)0x0) ||
         (elem_00->content->type != XML_ELEMENT_CONTENT_PCDATA)) {
        local_2758 = (xmlElementContentPtr)&elem_00->content;
        iVar19 = 1;
        pp_Var10 = &elem->children;
        while (p_Var12 = *pp_Var10, p_Var12 != (_xmlNode *)0x0) {
          if (p_Var12->type == XML_ELEMENT_NODE) {
            pxVar25 = p_Var12->name;
            pxVar22 = local_2758;
            if ((p_Var12->ns != (xmlNs *)0x0) &&
               (pxVar11 = p_Var12->ns->prefix, pxVar11 != (xmlChar *)0x0)) {
              pxVar11 = xmlBuildQName(pxVar25,pxVar11,fn,0x32);
              pxVar21 = local_2758;
              if (pxVar11 == (xmlChar *)0x0) {
                return 0;
              }
              for (; pxVar21 = *(xmlElementContentPtr *)pxVar21,
                  pxVar21 != (xmlElementContentPtr)0x0; pxVar21 = (xmlElementContentPtr)&pxVar21->c2
                  ) {
                if (pxVar21->type == XML_ELEMENT_CONTENT_OR) {
                  p_Var5 = pxVar21->c1;
                  if (p_Var5 != (_xmlElementContent *)0x0) {
                    if (p_Var5->type == XML_ELEMENT_CONTENT_ELEMENT) {
                      pxVar24 = p_Var5->name;
                      goto LAB_0018dd78;
                    }
                    if (p_Var5->type == XML_ELEMENT_CONTENT_PCDATA) goto LAB_0018dd92;
                  }
LAB_0018dd98:
                  xmlErrValid((xmlValidCtxtPtr)0x0,XML_DTD_MIXED_CORRUPT,
                              "Internal: MIXED struct corrupted\n",(char *)0x0);
                  break;
                }
                if (pxVar21->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_0018dd98;
                pxVar24 = pxVar21->name;
LAB_0018dd78:
                iVar7 = xmlStrEqual(pxVar24,pxVar11);
                if (iVar7 != 0) break;
LAB_0018dd92:
              }
              if ((pxVar11 != fn) && (pxVar11 != p_Var12->name)) {
                (*xmlFree)(pxVar11);
              }
              pxVar22 = local_2758;
              if (pxVar21 != (xmlElementContentPtr)0x0) goto LAB_0018de66;
            }
            for (; pxVar22 = *(xmlElementContentPtr *)pxVar22, pxVar22 != (xmlElementContentPtr)0x0;
                pxVar22 = (xmlElementContentPtr)&pxVar22->c2) {
              if (pxVar22->type == XML_ELEMENT_CONTENT_OR) {
                p_Var5 = pxVar22->c1;
                if (p_Var5 != (_xmlElementContent *)0x0) {
                  if (p_Var5->type == XML_ELEMENT_CONTENT_ELEMENT) {
                    pxVar11 = p_Var5->name;
                    goto LAB_0018de0b;
                  }
                  if (p_Var5->type == XML_ELEMENT_CONTENT_PCDATA) goto LAB_0018de20;
                }
LAB_0018de26:
                xmlErrValid(ctxt,XML_DTD_MIXED_CORRUPT,"Internal: MIXED struct corrupted\n",
                            (char *)0x0);
                goto LAB_0018de66;
              }
              if (pxVar22->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_0018de26;
              pxVar11 = pxVar22->name;
LAB_0018de0b:
              iVar7 = xmlStrEqual(pxVar11,pxVar25);
              if (iVar7 != 0) goto LAB_0018de66;
LAB_0018de20:
            }
            xmlErrValidNode(ctxt,elem,XML_DTD_INVALID_CHILD,
                            "Element %s is not declared in %s list of possible children\n",pxVar25,
                            elem->name,(xmlChar *)0x0);
            iVar19 = 0;
          }
LAB_0018de66:
          pp_Var10 = &p_Var12->next;
        }
        goto switchD_0018db6a_caseD_2;
      }
      if (elem->type == XML_ELEMENT_NODE) {
        p_Var12 = elem->children;
LAB_0018dbcd:
        do {
          if ((p_Var12 == (xmlNodePtr)0x0) || (xVar2 = p_Var12->type, XML_COMMENT_NODE < xVar2))
          goto LAB_0018e1d1;
          if ((0x198U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
            if (xVar2 != XML_ENTITY_REF_NODE) goto LAB_0018e1d1;
            if ((p_Var12->children != (_xmlNode *)0x0) &&
               (p_Var12->children->children != (_xmlNode *)0x0)) {
              nodeVPush(ctxt,p_Var12);
              p_Var12 = p_Var12->children->children;
              goto LAB_0018dbcd;
            }
          }
          do {
            p_Var12 = p_Var12->next;
            if (p_Var12 != (_xmlNode *)0x0) goto LAB_0018dbcd;
            p_Var12 = nodeVPop(ctxt);
          } while (p_Var12 != (xmlNodePtr)0x0);
          p_Var12 = (xmlNodePtr)0x0;
        } while( true );
      }
      goto LAB_0018e1fc;
    case XML_ELEMENT_TYPE_ELEMENT:
      iVar7 = 1;
      iVar19 = 1;
      if ((doc->standalone == 1) && (iVar19 = 1, extsubset == 1)) {
        iVar19 = 1;
        pp_Var10 = &elem->children;
        while (p_Var12 = *pp_Var10, p_Var12 != (_xmlNode *)0x0) {
          if (p_Var12->type == XML_TEXT_NODE) {
            for (pbVar16 = p_Var12->content; uVar18 = (ulong)*pbVar16, uVar18 < 0x21;
                pbVar16 = pbVar16 + 1) {
              if ((0x100002600U >> (uVar18 & 0x3f) & 1) == 0) {
                if (uVar18 == 0) {
                  iVar19 = 0;
                  xmlErrValidNode(ctxt,elem,XML_DTD_STANDALONE_WHITE_SPACE,
                                  "standalone: %s declared in the external subset contains white spaces nodes\n"
                                  ,elem->name,(xmlChar *)0x0,(xmlChar *)0x0);
                  goto LAB_0018de95;
                }
                break;
              }
            }
          }
          pp_Var10 = &p_Var12->next;
        }
LAB_0018de95:
        if (ctxt != (xmlValidCtxtPtr)0x0) goto LAB_0018de9e;
      }
      else {
LAB_0018de9e:
        node = elem->children;
        pxVar25 = elem_00->name;
        local_2758 = elem_00->content;
        comp = elem_00->contModel;
        if (comp == (xmlRegexpPtr)0x0) {
          iVar7 = xmlValidBuildContentModel(ctxt,elem_00);
          comp = elem_00->contModel;
          if (comp == (xmlRegexpPtr)0x0) goto LAB_0018e010;
        }
        iVar8 = xmlRegexpIsDeterminist(comp);
        if (iVar8 != 0) {
          ctxt->nodeNr = 0;
          ctxt->nodeMax = 0;
          ctxt->nodeTab = (xmlNodePtr *)0x0;
          local_2750 = pxVar25;
          exec = xmlRegNewExecCtxt(elem_00->contModel,(xmlRegExecCallbacks)0x0,(void *)0x0);
          p_Var12 = node;
          if (exec != (xmlRegExecCtxtPtr)0x0) {
LAB_0018df12:
            if (p_Var12 == (xmlNode *)0x0) goto LAB_0018e019;
            iVar7 = 0;
            switch(p_Var12->type) {
            case XML_ELEMENT_NODE:
              if ((p_Var12->ns == (xmlNs *)0x0) ||
                 (pxVar25 = p_Var12->ns->prefix, pxVar25 == (xmlChar *)0x0)) {
                xmlRegExecPushString(exec,p_Var12->name,(void *)0x0);
              }
              else {
                pxVar25 = xmlBuildQName(p_Var12->name,pxVar25,fn,0x32);
                if (pxVar25 == (xmlChar *)0x0) {
                  iVar7 = -1;
                  goto switchD_0018df3a_caseD_4;
                }
                xmlRegExecPushString(exec,pxVar25,(void *)0x0);
                if ((pxVar25 != fn) && (pxVar25 != p_Var12->name)) {
                  (*xmlFree)(pxVar25);
                }
              }
              break;
            case XML_TEXT_NODE:
              iVar8 = xmlIsBlankNode(p_Var12);
              if (iVar8 == 0) goto switchD_0018df3a_caseD_4;
              break;
            case XML_CDATA_SECTION_NODE:
              goto switchD_0018df3a_caseD_4;
            case XML_ENTITY_REF_NODE:
              if ((p_Var12->children == (_xmlNode *)0x0) ||
                 (p_Var12->children->children == (_xmlNode *)0x0)) break;
              nodeVPush(ctxt,p_Var12);
              p_Var12 = p_Var12->children->children;
              goto LAB_0018df12;
            }
            do {
              pp_Var10 = &p_Var12->next;
              p_Var12 = *pp_Var10;
              if (*pp_Var10 != (_xmlNode *)0x0) goto LAB_0018df12;
              p_Var12 = nodeVPop(ctxt);
            } while (p_Var12 != (xmlNodePtr)0x0);
            p_Var12 = (xmlNode *)0x0;
            goto LAB_0018df12;
          }
          goto LAB_0018e034;
        }
      }
LAB_0018e010:
      iVar19 = -1;
      goto switchD_0018db6a_caseD_2;
    }
    goto LAB_0018db10;
  case XML_ATTRIBUTE_NODE:
    pcVar14 = "Attribute element not expected\n";
    break;
  case XML_TEXT_NODE:
    if (elem->children == (_xmlNode *)0x0) {
      if (elem->ns == (xmlNs *)0x0) {
        if (elem->content != (xmlChar *)0x0) {
          return 1;
        }
        pcVar14 = "Text element has no content !\n";
      }
      else {
        pcVar14 = "Text element has namespace !\n";
      }
    }
    else {
      pcVar14 = "Text element has children !\n";
    }
    break;
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    goto switchD_0018d78f_caseD_4;
  case XML_ENTITY_NODE:
    pcVar14 = "Entity element not expected\n";
    break;
  case XML_DOCUMENT_NODE:
  case XML_DOCUMENT_TYPE_NODE:
  case XML_DOCUMENT_FRAG_NODE:
    pcVar14 = "Document element not expected\n";
    break;
  case XML_NOTATION_NODE:
    pcVar14 = "Notation element not expected\n";
    break;
  case XML_HTML_DOCUMENT_NODE:
    pcVar14 = "HTML Document not expected\n";
    break;
  default:
    pcVar14 = "unknown element type\n";
  }
  xVar15 = XML_ERR_INTERNAL_ERROR;
  pxVar25 = (xmlChar *)0x0;
LAB_0018db10:
  iVar19 = 0;
  xmlErrValidNode(ctxt,elem,xVar15,pcVar14,pxVar25,(xmlChar *)0x0,(xmlChar *)0x0);
switchD_0018d78f_caseD_4:
  return iVar19;
LAB_0018e019:
  iVar7 = xmlRegExecPushString(exec,(xmlChar *)0x0,(void *)0x0);
switchD_0018df3a_caseD_4:
  xmlRegFreeExecCtxt(exec);
LAB_0018e034:
  bVar6 = false;
  if ((iVar7 != -3) && (bVar6 = false, iVar7 != 1)) {
    fn[0] = '\0';
    xmlSnprintfElementContent((char *)fn,5000,local_2758,1);
    local_2748[0] = '\0';
    if (node != (xmlNode *)0x0) {
      sVar13 = strlen((char *)local_2748);
      (local_2748 + sVar13)[0] = '(';
      (local_2748 + sVar13)[1] = '\0';
      for (; node != (xmlNode *)0x0; node = node->next) {
        sVar13 = strlen((char *)local_2748);
        uVar17 = (uint)sVar13;
        if (0x1356 < (int)uVar17) {
          if (uVar17 < 0x1384) {
LAB_0018e24a:
            if (local_2748[(int)(uVar17 - 1)] != '.') {
              sVar13 = strlen((char *)local_2748);
              builtin_memcpy(local_2748 + sVar13," ...",4);
              *(undefined1 *)((long)auStack_2744 + sVar13) = 0;
            }
          }
          goto LAB_0018e26d;
        }
        switch(node->type) {
        case XML_ELEMENT_NODE:
          if ((node->ns != (xmlNs *)0x0) && (pxVar25 = node->ns->prefix, pxVar25 != (xmlChar *)0x0))
          {
            iVar7 = xmlStrlen(pxVar25);
            if ((int)(5000 - uVar17) < iVar7 + 10) goto LAB_0018e24a;
            strcat((char *)local_2748,(char *)node->ns->prefix);
            sVar13 = strlen((char *)local_2748);
            (local_2748 + sVar13)[0] = ':';
            (local_2748 + sVar13)[1] = '\0';
          }
          iVar7 = xmlStrlen(node->name);
          if ((int)(5000 - uVar17) < iVar7 + 10) goto LAB_0018e24a;
          strcat((char *)local_2748,(char *)node->name);
          if (node->next == (_xmlNode *)0x0) break;
          goto LAB_0018e1b4;
        case XML_ATTRIBUTE_NODE:
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_NOTATION_NODE:
        case XML_HTML_DOCUMENT_NODE:
        case XML_NAMESPACE_DECL:
          sVar13 = strlen((char *)local_2748);
          builtin_memcpy(local_2748 + sVar13,"???",4);
          goto LAB_0018e1ad;
        case XML_TEXT_NODE:
          iVar7 = xmlIsBlankNode(node);
          if (iVar7 == 0) goto switchD_0018e0d5_caseD_4;
          break;
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
switchD_0018e0d5_caseD_4:
          sVar13 = strlen((char *)local_2748);
          builtin_memcpy(local_2748 + sVar13,"CDAT",4);
          *(undefined2 *)((long)auStack_2744 + sVar13) = 0x41;
LAB_0018e1ad:
          if (node->next != (_xmlNode *)0x0) {
LAB_0018e1b4:
            sVar13 = strlen((char *)local_2748);
            (local_2748 + sVar13)[0] = ' ';
            (local_2748 + sVar13)[1] = '\0';
          }
        }
      }
      sVar13 = strlen((char *)local_2748);
      (local_2748 + sVar13)[0] = ')';
      (local_2748 + sVar13)[1] = '\0';
    }
LAB_0018e26d:
    if (local_2750 == (xmlChar *)0x0) {
      pxVar25 = (xmlChar *)0x0;
      pcVar14 = "Element content does not follow the DTD, expecting %s, got %s\n";
      pxVar24 = fn;
      pxVar11 = local_2748;
    }
    else {
      pxVar25 = local_2748;
      pcVar14 = "Element %s content does not follow the DTD, expecting %s, got %s\n";
      pxVar11 = fn;
      pxVar24 = local_2750;
    }
    xmlErrValidNode(ctxt,elem,XML_DTD_CONTENT_MODEL,pcVar14,pxVar24,pxVar11,pxVar25);
    bVar6 = true;
  }
  ctxt->nodeNr = 0;
  ctxt->nodeMax = 0;
  if (ctxt->nodeTab != (xmlNodePtr *)0x0) {
    (*xmlFree)(ctxt->nodeTab);
    ctxt->nodeTab = (xmlNodePtr *)0x0;
  }
  if (bVar6) {
    iVar19 = 0;
  }
switchD_0018db6a_caseD_2:
  ppxVar23 = &elem_00->attributes;
  ppxVar1 = &elem->nsDef;
  do {
    pxVar3 = *ppxVar23;
    if (pxVar3 == (xmlAttributePtr)0x0) {
      return iVar19;
    }
    if (pxVar3->def == XML_ATTRIBUTE_FIXED) {
      pxVar25 = pxVar3->prefix;
      if (pxVar25 == (xmlChar *)0x0) {
        iVar7 = xmlStrEqual(pxVar3->name,"xmlns");
        pxVar9 = (xmlNs *)ppxVar1;
        if (iVar7 != 0) {
          do {
            pxVar9 = pxVar9->next;
            if (pxVar9 == (xmlNs *)0x0) goto LAB_0018da84;
          } while (pxVar9->prefix != (xmlChar *)0x0);
          iVar7 = xmlStrEqual(pxVar3->defaultValue,pxVar9->href);
          if (iVar7 == 0) {
            iVar19 = 0;
            xmlErrValidNode(ctxt,elem,XML_DTD_ELEM_DEFAULT_NAMESPACE,
                            "Element %s namespace name for default namespace does not match the DTD\n"
                            ,elem->name,(xmlChar *)0x0,(xmlChar *)0x0);
          }
          goto LAB_0018da84;
        }
        pxVar25 = pxVar3->prefix;
      }
      iVar7 = xmlStrEqual(pxVar25,"xmlns");
      pxVar9 = (xmlNs *)ppxVar1;
      if (iVar7 != 0) {
        do {
          pxVar9 = pxVar9->next;
          if (pxVar9 == (xmlNs *)0x0) goto LAB_0018da84;
          iVar7 = xmlStrEqual(pxVar3->name,pxVar9->prefix);
        } while (iVar7 == 0);
        iVar7 = xmlStrEqual(pxVar3->defaultValue,pxVar9->href);
        if (iVar7 == 0) {
          pxVar11 = elem->name;
          pxVar25 = pxVar9->prefix;
          pxVar24 = (xmlChar *)0x0;
          xVar15 = XML_DTD_ELEM_NAMESPACE;
          pcVar14 = "Element %s namespace name for %s does not match the DTD\n";
LAB_0018da4e:
          xmlErrValidNode(ctxt,elem,xVar15,pcVar14,pxVar11,pxVar25,pxVar24);
          iVar19 = 0;
        }
      }
    }
    else if (pxVar3->def == XML_ATTRIBUTE_REQUIRED) {
      pxVar25 = pxVar3->prefix;
      if (pxVar25 == (xmlChar *)0x0) {
        iVar7 = xmlStrEqual(pxVar3->name,"xmlns");
        pxVar9 = (xmlNs *)ppxVar1;
        if (iVar7 != 0) {
          do {
            pxVar9 = pxVar9->next;
            if (pxVar9 == (xmlNs *)0x0) goto LAB_0018da0b;
          } while (pxVar9->prefix != (xmlChar *)0x0);
          goto LAB_0018da84;
        }
        pxVar25 = pxVar3->prefix;
      }
      iVar7 = xmlStrEqual(pxVar25,"xmlns");
      pxVar9 = (xmlNs *)ppxVar1;
      if (iVar7 == 0) {
        iVar7 = -1;
        pp_Var20 = &elem->properties;
        while (p_Var4 = *pp_Var20, p_Var4 != (_xmlAttr *)0x0) {
          iVar8 = xmlStrEqual(p_Var4->name,pxVar3->name);
          if (iVar8 != 0) {
            if (pxVar3->prefix == (xmlChar *)0x0) goto LAB_0018da84;
            pxVar9 = p_Var4->ns;
            if ((pxVar9 == (xmlNs *)0x0) && (pxVar9 = elem->ns, pxVar9 == (xmlNs *)0x0)) {
              if (iVar7 < 1) {
                iVar7 = 0;
              }
            }
            else {
              iVar8 = xmlStrEqual(pxVar9->prefix,pxVar3->prefix);
              iVar7 = 1;
              if (iVar8 != 0) goto LAB_0018da84;
            }
          }
          pp_Var20 = &p_Var4->next;
        }
        if (iVar7 == 0) {
          xmlErrValidWarning(ctxt,elem,XML_DTD_NO_PREFIX,
                             "Element %s required attribute %s:%s has no prefix\n",elem->name,
                             pxVar3->prefix,pxVar3->name);
        }
        else {
          if (iVar7 == -1) {
LAB_0018da0b:
            pxVar11 = elem->name;
            if (pxVar3->prefix == (xmlChar *)0x0) {
              pxVar24 = (xmlChar *)0x0;
              xVar15 = XML_DTD_MISSING_ATTRIBUTE;
              pcVar14 = "Element %s does not carry attribute %s\n";
              pxVar25 = pxVar3->name;
            }
            else {
              xVar15 = XML_DTD_MISSING_ATTRIBUTE;
              pcVar14 = "Element %s does not carry attribute %s:%s\n";
              pxVar25 = pxVar3->prefix;
              pxVar24 = pxVar3->name;
            }
            goto LAB_0018da4e;
          }
          xmlErrValidWarning(ctxt,elem,XML_DTD_DIFFERENT_PREFIX,
                             "Element %s required attribute %s:%s has different prefix\n",elem->name
                             ,pxVar3->prefix,pxVar3->name);
        }
      }
      else {
        do {
          pxVar9 = pxVar9->next;
          if (pxVar9 == (xmlNs *)0x0) goto LAB_0018da0b;
          iVar7 = xmlStrEqual(pxVar3->name,pxVar9->prefix);
        } while (iVar7 == 0);
      }
    }
LAB_0018da84:
    ppxVar23 = &pxVar3->nexth;
  } while( true );
LAB_0018e1d1:
  ctxt->nodeNr = 0;
  ctxt->nodeMax = 0;
  if (ctxt->nodeTab != (xmlNodePtr *)0x0) {
    (*xmlFree)(ctxt->nodeTab);
    ctxt->nodeTab = (xmlNodePtr *)0x0;
  }
  iVar19 = 1;
  if (p_Var12 == (xmlNodePtr)0x0) goto switchD_0018db6a_caseD_2;
LAB_0018e1fc:
  pxVar25 = elem->name;
  pcVar14 = "Element %s was declared #PCDATA but contains non text nodes\n";
  xVar15 = XML_DTD_NOT_PCDATA;
LAB_0018e21a:
  iVar19 = 0;
  xmlErrValidNode(ctxt,elem,xVar15,pcVar14,pxVar25,(xmlChar *)0x0,(xmlChar *)0x0);
  goto switchD_0018db6a_caseD_2;
}

Assistant:

int
xmlValidateOneElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                      xmlNodePtr elem) {
    xmlElementPtr elemDecl = NULL;
    xmlElementContentPtr cont;
    xmlAttributePtr attr;
    xmlNodePtr child;
    int ret = 1, tmp;
    const xmlChar *name;
    int extsubset = 0;

    CHECK_DTD;

    if (elem == NULL) return(0);
    switch (elem->type) {
        case XML_ATTRIBUTE_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Attribute element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_TEXT_NODE:
	    if (elem->children != NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has children !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    if (elem->ns != NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has namespace !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    if (elem->content == NULL) {
		xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		                "Text element has no content !\n",
				NULL,NULL,NULL);
		return(0);
	    }
	    return(1);
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            return(1);
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
	    return(1);
        case XML_ENTITY_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Entity element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_NOTATION_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Notation element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "Document element not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_HTML_DOCUMENT_NODE:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "HTML Document not expected\n", NULL, NULL ,NULL);
	    return(0);
        case XML_ELEMENT_NODE:
	    break;
	default:
	    xmlErrValidNode(ctxt, elem, XML_ERR_INTERNAL_ERROR,
		   "unknown element type\n", NULL, NULL ,NULL);
	    return(0);
    }

    /*
     * Fetch the declaration
     */
    elemDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    if (elemDecl == NULL)
	return(0);

    /*
     * If vstateNr is not zero that means continuous validation is
     * activated, do not try to check the content model at that level.
     */
    if (ctxt->vstateNr == 0) {
    /* Check that the element content matches the definition */
    switch (elemDecl->etype) {
        case XML_ELEMENT_TYPE_UNDEFINED:
	    xmlErrValidNode(ctxt, elem, XML_DTD_UNKNOWN_ELEM,
	                    "No declaration for element %s\n",
		   elem->name, NULL, NULL);
	    return(0);
        case XML_ELEMENT_TYPE_EMPTY:
	    if (elem->children != NULL) {
		xmlErrValidNode(ctxt, elem, XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
	               elem->name, NULL, NULL);
		ret = 0;
	    }
	    break;
        case XML_ELEMENT_TYPE_ANY:
	    /* I don't think anything is required then */
	    break;
        case XML_ELEMENT_TYPE_MIXED:

	    /* simple case of declared as #PCDATA */
	    if ((elemDecl->content != NULL) &&
		(elemDecl->content->type == XML_ELEMENT_CONTENT_PCDATA)) {
		ret = xmlValidateOneCdataElement(ctxt, doc, elem);
		if (!ret) {
		    xmlErrValidNode(ctxt, elem, XML_DTD_NOT_PCDATA,
	       "Element %s was declared #PCDATA but contains non text nodes\n",
			   elem->name, NULL, NULL);
		}
		break;
	    }
	    child = elem->children;
	    /* Hum, this start to get messy */
	    while (child != NULL) {
	        if (child->type == XML_ELEMENT_NODE) {
		    name = child->name;
		    if ((child->ns != NULL) && (child->ns->prefix != NULL)) {
			xmlChar fn[50];
			xmlChar *fullname;

			fullname = xmlBuildQName(child->name, child->ns->prefix,
				                 fn, 50);
			if (fullname == NULL)
			    return(0);
			cont = elemDecl->content;
			while (cont != NULL) {
			    if (cont->type == XML_ELEMENT_CONTENT_ELEMENT) {
				if (xmlStrEqual(cont->name, fullname))
				    break;
			    } else if ((cont->type == XML_ELEMENT_CONTENT_OR) &&
			       (cont->c1 != NULL) &&
			       (cont->c1->type == XML_ELEMENT_CONTENT_ELEMENT)){
				if (xmlStrEqual(cont->c1->name, fullname))
				    break;
			    } else if ((cont->type != XML_ELEMENT_CONTENT_OR) ||
				(cont->c1 == NULL) ||
				(cont->c1->type != XML_ELEMENT_CONTENT_PCDATA)){
				xmlErrValid(NULL, XML_DTD_MIXED_CORRUPT,
					"Internal: MIXED struct corrupted\n",
					NULL);
				break;
			    }
			    cont = cont->c2;
			}
			if ((fullname != fn) && (fullname != child->name))
			    xmlFree(fullname);
			if (cont != NULL)
			    goto child_ok;
		    }
		    cont = elemDecl->content;
		    while (cont != NULL) {
		        if (cont->type == XML_ELEMENT_CONTENT_ELEMENT) {
			    if (xmlStrEqual(cont->name, name)) break;
			} else if ((cont->type == XML_ELEMENT_CONTENT_OR) &&
			   (cont->c1 != NULL) &&
			   (cont->c1->type == XML_ELEMENT_CONTENT_ELEMENT)) {
			    if (xmlStrEqual(cont->c1->name, name)) break;
			} else if ((cont->type != XML_ELEMENT_CONTENT_OR) ||
			    (cont->c1 == NULL) ||
			    (cont->c1->type != XML_ELEMENT_CONTENT_PCDATA)) {
			    xmlErrValid(ctxt, XML_DTD_MIXED_CORRUPT,
				    "Internal: MIXED struct corrupted\n",
				    NULL);
			    break;
			}
			cont = cont->c2;
		    }
		    if (cont == NULL) {
			xmlErrValidNode(ctxt, elem, XML_DTD_INVALID_CHILD,
	       "Element %s is not declared in %s list of possible children\n",
			       name, elem->name, NULL);
			ret = 0;
		    }
		}
child_ok:
	        child = child->next;
	    }
	    break;
        case XML_ELEMENT_TYPE_ELEMENT:
	    if ((doc->standalone == 1) && (extsubset == 1)) {
		/*
		 * VC: Standalone Document Declaration
		 *     - element types with element content, if white space
		 *       occurs directly within any instance of those types.
		 */
		child = elem->children;
		while (child != NULL) {
		    if (child->type == XML_TEXT_NODE) {
			const xmlChar *content = child->content;

			while (IS_BLANK_CH(*content))
			    content++;
			if (*content == 0) {
			    xmlErrValidNode(ctxt, elem,
			                    XML_DTD_STANDALONE_WHITE_SPACE,
"standalone: %s declared in the external subset contains white spaces nodes\n",
				   elem->name, NULL, NULL);
			    ret = 0;
			    break;
			}
		    }
		    child =child->next;
		}
	    }
	    child = elem->children;
	    cont = elemDecl->content;
	    tmp = xmlValidateElementContent(ctxt, child, elemDecl, 1, elem);
	    if (tmp <= 0)
		ret = tmp;
	    break;
    }
    } /* not continuous */

    /* [ VC: Required Attribute ] */
    attr = elemDecl->attributes;
    while (attr != NULL) {
	if (attr->def == XML_ATTRIBUTE_REQUIRED) {
	    int qualified = -1;

	    if ((attr->prefix == NULL) &&
		(xmlStrEqual(attr->name, BAD_CAST "xmlns"))) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (ns->prefix == NULL)
			goto found;
		    ns = ns->next;
		}
	    } else if (xmlStrEqual(attr->prefix, BAD_CAST "xmlns")) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (xmlStrEqual(attr->name, ns->prefix))
			goto found;
		    ns = ns->next;
		}
	    } else {
		xmlAttrPtr attrib;

		attrib = elem->properties;
		while (attrib != NULL) {
		    if (xmlStrEqual(attrib->name, attr->name)) {
			if (attr->prefix != NULL) {
			    xmlNsPtr nameSpace = attrib->ns;

			    if (nameSpace == NULL)
				nameSpace = elem->ns;
			    /*
			     * qualified names handling is problematic, having a
			     * different prefix should be possible but DTDs don't
			     * allow to define the URI instead of the prefix :-(
			     */
			    if (nameSpace == NULL) {
				if (qualified < 0)
				    qualified = 0;
			    } else if (!xmlStrEqual(nameSpace->prefix,
						    attr->prefix)) {
				if (qualified < 1)
				    qualified = 1;
			    } else
				goto found;
			} else {
			    /*
			     * We should allow applications to define namespaces
			     * for their application even if the DTD doesn't
			     * carry one, otherwise, basically we would always
			     * break.
			     */
			    goto found;
			}
		    }
		    attrib = attrib->next;
		}
	    }
	    if (qualified == -1) {
		if (attr->prefix == NULL) {
		    xmlErrValidNode(ctxt, elem, XML_DTD_MISSING_ATTRIBUTE,
		       "Element %s does not carry attribute %s\n",
			   elem->name, attr->name, NULL);
		    ret = 0;
	        } else {
		    xmlErrValidNode(ctxt, elem, XML_DTD_MISSING_ATTRIBUTE,
		       "Element %s does not carry attribute %s:%s\n",
			   elem->name, attr->prefix,attr->name);
		    ret = 0;
		}
	    } else if (qualified == 0) {
		xmlErrValidWarning(ctxt, elem, XML_DTD_NO_PREFIX,
		   "Element %s required attribute %s:%s has no prefix\n",
		       elem->name, attr->prefix, attr->name);
	    } else if (qualified == 1) {
		xmlErrValidWarning(ctxt, elem, XML_DTD_DIFFERENT_PREFIX,
		   "Element %s required attribute %s:%s has different prefix\n",
		       elem->name, attr->prefix, attr->name);
	    }
	} else if (attr->def == XML_ATTRIBUTE_FIXED) {
	    /*
	     * Special tests checking #FIXED namespace declarations
	     * have the right value since this is not done as an
	     * attribute checking
	     */
	    if ((attr->prefix == NULL) &&
		(xmlStrEqual(attr->name, BAD_CAST "xmlns"))) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (ns->prefix == NULL) {
			if (!xmlStrEqual(attr->defaultValue, ns->href)) {
			    xmlErrValidNode(ctxt, elem,
			           XML_DTD_ELEM_DEFAULT_NAMESPACE,
   "Element %s namespace name for default namespace does not match the DTD\n",
				   elem->name, NULL, NULL);
			    ret = 0;
			}
			goto found;
		    }
		    ns = ns->next;
		}
	    } else if (xmlStrEqual(attr->prefix, BAD_CAST "xmlns")) {
		xmlNsPtr ns;

		ns = elem->nsDef;
		while (ns != NULL) {
		    if (xmlStrEqual(attr->name, ns->prefix)) {
			if (!xmlStrEqual(attr->defaultValue, ns->href)) {
			    xmlErrValidNode(ctxt, elem, XML_DTD_ELEM_NAMESPACE,
		   "Element %s namespace name for %s does not match the DTD\n",
				   elem->name, ns->prefix, NULL);
			    ret = 0;
			}
			goto found;
		    }
		    ns = ns->next;
		}
	    }
	}
found:
        attr = attr->nexth;
    }
    return(ret);
}